

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O1

void job_fin(job_t *job)

{
  ulong uVar1;
  
  if (job->name != (char *)0x0) {
    free(job->name);
  }
  if ((job->cmdv).n != 0) {
    if (((job->cmdv).icd.dtor != (undefined1 *)0x0) && ((job->cmdv).i != 0)) {
      uVar1 = 0;
      do {
        (*(code *)(job->cmdv).icd.dtor)((job->cmdv).d + (job->cmdv).icd.sz * uVar1);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (job->cmdv).i);
    }
    free((job->cmdv).d);
  }
  (job->cmdv).n = 0;
  if ((job->envv).n != 0) {
    if (((job->envv).icd.dtor != (undefined1 *)0x0) && ((job->envv).i != 0)) {
      uVar1 = 0;
      do {
        (*(code *)(job->envv).icd.dtor)((job->envv).d + (job->envv).icd.sz * uVar1);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (job->envv).i);
    }
    free((job->envv).d);
  }
  (job->envv).n = 0;
  if ((job->depv).n != 0) {
    if (((job->depv).icd.dtor != (undefined1 *)0x0) && ((job->depv).i != 0)) {
      uVar1 = 0;
      do {
        (*(code *)(job->depv).icd.dtor)((job->depv).d + (job->depv).icd.sz * uVar1);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (job->depv).i);
    }
    free((job->depv).d);
  }
  (job->depv).n = 0;
  if ((job->rlim).n != 0) {
    if (((job->rlim).icd.dtor != (undefined1 *)0x0) && ((job->rlim).i != 0)) {
      uVar1 = 0;
      do {
        (*(code *)(job->rlim).icd.dtor)((job->rlim).d + (job->rlim).icd.sz * uVar1);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (job->rlim).i);
    }
    free((job->rlim).d);
  }
  (job->rlim).n = 0;
  if (job->dir != (char *)0x0) {
    free(job->dir);
  }
  if (job->out != (char *)0x0) {
    free(job->out);
  }
  if (job->err != (char *)0x0) {
    free(job->err);
  }
  if (job->in != (char *)0x0) {
    free(job->in);
    return;
  }
  return;
}

Assistant:

void job_fin(job_t *job) { 
  if (job->name) free(job->name);
  utarray_done(&job->cmdv); 
  utarray_done(&job->envv); 
  utarray_done(&job->depv); 
  utarray_done(&job->rlim); 
  if (job->dir) free(job->dir);
  if (job->out) free(job->out);
  if (job->err) free(job->err);
  if (job->in) free(job->in);
}